

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O2

void __thiscall MainWindow::MainWindow(MainWindow *this)

{
  AudioEnumerator *this_00;
  MidiEnumerator *this_01;
  anon_class_1_0_00000001 *paVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  Module *this_02;
  TableModel<trackerboy::Instrument> *this_03;
  SongListModel *this_04;
  SongModel *this_05;
  PatternModel *this_06;
  TableModel<trackerboy::Waveform> *this_07;
  Renderer *this_08;
  QByteArray *state;
  QByteArray *state_00;
  int iVar5;
  float fVar6;
  undefined1 auVar7 [16];
  QArrayDataPointer<char16_t> local_598;
  undefined1 local_578 [24];
  undefined8 local_560;
  QSettings settings;
  QByteArray windowState;
  Config config;
  
  QMainWindow::QMainWindow(&this->super_QMainWindow,0,0);
  *(undefined ***)this = &PTR_metaObject_001f2a60;
  *(undefined ***)&this->field_0x10 = &PTR__MainWindow_001f2c18;
  this_00 = &this->mAudioEnumerator;
  AudioEnumerator::AudioEnumerator(this_00);
  this_01 = &this->mMidiEnumerator;
  MidiEnumerator::MidiEnumerator(this_01);
  tr(&this->mUntitledString,"Untitled",(char *)0x0,-1);
  PianoInput::PianoInput(&this->mPianoInput);
  Palette::Palette(&this->mPalette);
  Midi::Midi(&this->mMidi,(QObject *)0x0);
  this->mModule = (Module *)0x0;
  ModuleFile::ModuleFile(&this->mModuleFile);
  this->mErrorSinceLastConfig = false;
  (this->mLastEngineFrame).halted = true;
  *(undefined4 *)((long)&this->mFrameSkip + 1) = 0;
  *(undefined8 *)&(this->mLastEngineFrame).startedNewRow = 0;
  *(undefined8 *)((long)&(this->mLastEngineFrame).order + 1) = 0;
  this->mAutosaveIntervalMs = 30000;
  this->mAutosaveTimer = 0;
  this->mAudioDiag = (AudioDiagDialog *)0x0;
  this->mTempoCalc = (TempoCalculator *)0x0;
  this->mCommentsDialog = (CommentsDialog *)0x0;
  this->mInstrumentEditor = (InstrumentEditor *)0x0;
  this->mWaveEditor = (WaveEditor *)0x0;
  this->mHistoryDialog = (PersistantDialog *)0x0;
  this->mEffectsListDialog = (EffectsListDialog *)0x0;
  this_02 = (Module *)operator_new(0x1a8);
  Module::Module(this_02,(QObject *)this);
  this->mModule = this_02;
  this_03 = (TableModel<trackerboy::Instrument> *)operator_new(0x50);
  TableModel<trackerboy::Instrument>::TableModel(this_03,this_02,(QObject *)this);
  this->mInstrumentModel = this_03;
  this_04 = (SongListModel *)operator_new(0x30);
  SongListModel::SongListModel(this_04,this->mModule,(QObject *)this);
  this->mSongListModel = this_04;
  this_05 = (SongModel *)operator_new(0x20);
  SongModel::SongModel(this_05,this->mModule,(QObject *)this);
  this->mSongModel = this_05;
  this_06 = (PatternModel *)operator_new(0xf0);
  PatternModel::PatternModel(this_06,this->mModule,this_05,(QObject *)this);
  this->mPatternModel = this_06;
  this_07 = (TableModel<trackerboy::Waveform> *)operator_new(0x50);
  TableModel<trackerboy::Waveform>::TableModel(this_07,this->mModule,(QObject *)this);
  this->mWaveModel = this_07;
  this_08 = (Renderer *)operator_new(0x1518);
  Renderer::Renderer(this_08,this->mModule,(QObject *)this);
  this->mRenderer = this_08;
  setupUi(this);
  IconLocator::getAppIcon();
  QWidget::setWindowIcon((QIcon *)this);
  QIcon::~QIcon((QIcon *)&config);
  QSettings::QSettings(&settings,(QObject *)0x0);
  QSettings::beginGroup((QString *)&settings);
  local_598.d = (Data *)0x0;
  local_598.ptr = (char16_t *)0x0;
  local_598.size = 0;
  QVariant::QVariant((QVariant *)local_578,(QByteArray *)&local_598);
  QSettings::value((QString *)&config,(QVariant *)&settings);
  QVariant::toByteArray();
  cVar2 = QWidget::restoreGeometry((QByteArray *)this);
  QArrayDataPointer<char>::~QArrayDataPointer(&windowState.d);
  QVariant::~QVariant((QVariant *)&config);
  QVariant::~QVariant((QVariant *)local_578);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_598);
  if (cVar2 == '\0') {
    QGuiApplication::primaryScreen();
    auVar7 = QScreen::availableGeometry();
    iVar3 = ((auVar7._8_4_ - auVar7._0_4_) * 3 + 3) / 4;
    iVar5 = 0x500;
    if (iVar3 < 0x500) {
      iVar5 = iVar3;
    }
    iVar4 = ((auVar7._12_4_ - auVar7._4_4_) * 3 + 3) / 4;
    iVar3 = 0x2d0;
    if (iVar4 < 0x2d0) {
      iVar3 = iVar4;
    }
    config.mFonts.mFonts._0_4_ =
         (iVar5 + -1) / -2 + (int)(((long)auVar7._8_4_ + (long)auVar7._0_4_) / 2);
    config.mFonts.mFonts._4_4_ =
         (iVar3 + -1) / -2 + (int)(((auVar7._8_8_ >> 0x20) + (auVar7._0_8_ >> 0x20)) / 2);
    config.mFonts.mFonts._8_4_ = iVar5 + config.mFonts.mFonts._0_4_ + -1;
    config.mFonts.mFonts._12_4_ = iVar3 + -1 + config.mFonts.mFonts._4_4_;
    QWidget::setGeometry((QRect *)this);
  }
  local_578._0_8_ = (PrivateShared *)0x0;
  local_578._8_8_ = 0;
  local_578._16_8_ = 0;
  local_560 = 2;
  QSettings::value((QString *)&config,(QVariant *)&settings);
  QVariant::toByteArray();
  QVariant::~QVariant((QVariant *)&config);
  QVariant::~QVariant((QVariant *)local_578);
  if (windowState.d.size != 0) {
    QMainWindow::addToolBar((QToolBar *)this);
    QMainWindow::addToolBar((QToolBar *)this);
    QMainWindow::addToolBar((QToolBar *)this);
    QMainWindow::addToolBar((QToolBar *)this);
    QMainWindow::addToolBar((QToolBar *)this);
    cVar2 = QMainWindow::restoreState((QByteArray *)this,(int)&windowState);
    if (cVar2 != '\0') goto LAB_00157900;
  }
  initState(this);
LAB_00157900:
  paVar1 = (anon_class_1_0_00000001 *)this->mVSplitter;
  local_578._0_8_ = (PrivateShared *)0x0;
  local_578._8_8_ = 0;
  local_578._16_8_ = 0;
  local_560 = 2;
  QSettings::value((QString *)&config,(QVariant *)&settings);
  fVar6 = (float)QVariant::toByteArray();
  MainWindow::anon_class_1_0_00000001::operator()(paVar1,(QSplitter *)&local_598,state,fVar6);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_598);
  QVariant::~QVariant((QVariant *)&config);
  QVariant::~QVariant((QVariant *)local_578);
  paVar1 = (anon_class_1_0_00000001 *)this->mHSplitter;
  local_578._0_8_ = (PrivateShared *)0x0;
  local_578._8_8_ = 0;
  local_578._16_8_ = 0;
  local_560 = 2;
  QSettings::value((QString *)&config,(QVariant *)&settings);
  fVar6 = (float)QVariant::toByteArray();
  MainWindow::anon_class_1_0_00000001::operator()(paVar1,(QSplitter *)&local_598,state_00,fVar6);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_598);
  QVariant::~QVariant((QVariant *)&config);
  QVariant::~QVariant((QVariant *)local_578);
  ModuleFile::setName(&this->mModuleFile,&this->mUntitledString);
  updateWindowTitle(this);
  Config::Config(&config);
  Config::readSettings(&config,this_00,this_01);
  applyConfig(this,&config,(Categories)0x1f,(QString *)0x0);
  Config::writeSettings(&config,this_00,this_01);
  QWidget::setAcceptDrops(SUB81(this,0));
  local_578._0_8_ = (PrivateShared *)0x0;
  local_578._8_8_ = L"\nQToolBar QLabel {\n    padding-left: 3px;\n    padding-right: 3px;\n}\n    "
  ;
  local_578._16_8_ = 0x48;
  local_598.d = (Data *)0x0;
  local_598.ptr = (char16_t *)0x0;
  local_598.size = 0;
  QWidget::setStyleSheet((QString *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_578);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_598);
  Config::~Config(&config);
  QArrayDataPointer<char>::~QArrayDataPointer(&windowState.d);
  QSettings::~QSettings(&settings);
  return;
}

Assistant:

MainWindow::MainWindow() :
    QMainWindow(),
    mAudioEnumerator(),
    mUntitledString(tr("Untitled")),
    mPianoInput(),
    mMidi(),
    mModule(),
    mModuleFile(),
    mErrorSinceLastConfig(false),
    mLastEngineFrame(),
    mFrameSkip(0),
    mAutosave(false),
    mAutosaveIntervalMs(30000),
    mAudioDiag(nullptr),
    mTempoCalc(nullptr),
    mCommentsDialog(nullptr),
    mInstrumentEditor(nullptr),
    mWaveEditor(nullptr),
    mHistoryDialog(nullptr),
    mEffectsListDialog(nullptr)
{

    // create models
    mModule = new Module(this);
    mInstrumentModel = new InstrumentListModel(*mModule, this);
    mSongListModel = new SongListModel(*mModule, this);
    mSongModel = new SongModel(*mModule, this);
    mPatternModel = new PatternModel(*mModule, *mSongModel, this);
    mWaveModel = new WaveListModel(*mModule, this);

    mRenderer = new Renderer(*mModule, this);

    setupUi();

    // read in application configuration
    //mConfig.readSettings(mAudioEnumerator, mMidiEnumerator);
    
    setWindowIcon(IconLocator::getAppIcon());

    QSettings settings;
    settings.beginGroup(TU::KEY_MAIN_WINDOW);

    // restore geomtry from the last session
    if (!restoreGeometry(settings.value(TU::KEY_GEOMETRY, QByteArray()).toByteArray())) {
        // no saved geometry, initialize it
        // we will take 3/4 of the primary screen's width and height, but we
        // will take no more than 1280x720

        // maximum initial resolution
        constexpr int MAX_WIDTH = 1280;
        constexpr int MAX_HEIGHT = 720;

        // get the available geometry for the primary screen
        auto const availableGeometry = QApplication::primaryScreen()->availableGeometry();

        QRect newGeometry(
            0,
            0, 
            std::min(MAX_WIDTH, availableGeometry.width() * 3 / 4),
            std::min(MAX_HEIGHT, availableGeometry.height() * 3 / 4)
        );

        newGeometry.moveTo(availableGeometry.center() - newGeometry.center());
        setGeometry(newGeometry);
    }

    // restore window state if it exists
    auto const windowState = settings.value(TU::KEY_WINDOW_STATE).toByteArray();
    if (windowState.isEmpty()) {
        // default layout
        initState();
    } else {
        addToolBar(mToolbarFile);
        addToolBar(mToolbarEdit);
        addToolBar(mToolbarSong);
        addToolBar(mToolbarTracker);
        addToolBar(mToolbarInput);
        if (!restoreState(windowState, TU::WINDOW_STATE_VERSION)) {
            initState();
        }
    }

    // restore splitter sizes
    auto restoreSplitter = [](QSplitter &splitter, QByteArray const& state, float defaultRatio) {
        if (!splitter.restoreState(state)) {
            rationSplitter(splitter, defaultRatio);
        }
    };
    restoreSplitter(*mVSplitter, settings.value(TU::KEY_VSPLITTER).toByteArray(), TU::DEFAULT_VSPLITTER_RATIO);
    restoreSplitter(*mHSplitter, settings.value(TU::KEY_HSPLITTER).toByteArray(), TU::DEFAULT_HSPLITTER_RATIO);

    mModuleFile.setName(mUntitledString);
    updateWindowTitle();

    // apply the read in configuration
    Config config;
    config.readSettings(mAudioEnumerator, mMidiEnumerator);
    applyConfig(config, Config::CategoryAll);
    config.writeSettings(mAudioEnumerator, mMidiEnumerator);

    setAcceptDrops(true);

    setStyleSheet(QStringLiteral(R"stylesheet(
QToolBar QLabel {
    padding-left: 3px;
    padding-right: 3px;
}
    )stylesheet"));
}